

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint32_t absl::lts_20250127::hash_internal::Hash32Len13to24(char *s,size_t len)

{
  uint32_t uVar1;
  uint32_t a_00;
  uint32_t a_01;
  uint32_t a_02;
  uint32_t a_03;
  uint32_t a_04;
  uint32_t h;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  size_t len_local;
  char *s_local;
  
  uVar1 = Fetch32(s + ((len >> 1) - 4));
  a_00 = Fetch32(s + 4);
  a_01 = Fetch32(s + (len - 8));
  a_02 = Fetch32(s + (len >> 1));
  a_03 = Fetch32(s);
  a_04 = Fetch32(s + (len - 4));
  uVar1 = Mur(uVar1,(uint32_t)len);
  uVar1 = Mur(a_00,uVar1);
  uVar1 = Mur(a_01,uVar1);
  uVar1 = Mur(a_02,uVar1);
  uVar1 = Mur(a_03,uVar1);
  uVar1 = Mur(a_04,uVar1);
  uVar1 = fmix(uVar1);
  return uVar1;
}

Assistant:

static uint32_t Hash32Len13to24(const char *s, size_t len) {
  uint32_t a = Fetch32(s - 4 + (len >> 1));
  uint32_t b = Fetch32(s + 4);
  uint32_t c = Fetch32(s + len - 8);
  uint32_t d = Fetch32(s + (len >> 1));
  uint32_t e = Fetch32(s);
  uint32_t f = Fetch32(s + len - 4);
  uint32_t h = static_cast<uint32_t>(len);

  return fmix(Mur(f, Mur(e, Mur(d, Mur(c, Mur(b, Mur(a, h)))))));
}